

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

char * event_mm_strdup_(char *str)

{
  int *piVar1;
  size_t sVar2;
  void *p;
  size_t ln;
  char *str_local;
  
  if (str == (char *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    str_local = (char *)0x0;
  }
  else if (mm_malloc_fn_ == (_func_void_ptr_size_t *)0x0) {
    str_local = strdup(str);
  }
  else {
    sVar2 = strlen(str);
    if ((sVar2 == 0xffffffffffffffff) ||
       (str_local = (char *)(*mm_malloc_fn_)(sVar2 + 1), str_local == (char *)0x0)) {
      piVar1 = __errno_location();
      *piVar1 = 0xc;
      str_local = (char *)0x0;
    }
    else {
      memcpy(str_local,str,sVar2 + 1);
    }
  }
  return str_local;
}

Assistant:

char *
event_mm_strdup_(const char *str)
{
	if (!str) {
		errno = EINVAL;
		return NULL;
	}

	if (mm_malloc_fn_) {
		size_t ln = strlen(str);
		void *p = NULL;
		if (ln == EV_SIZE_MAX)
			goto error;
		p = mm_malloc_fn_(ln+1);
		if (p)
			return memcpy(p, str, ln+1);
	} else
#ifdef _WIN32
		return _strdup(str);
#else
		return strdup(str);
#endif

error:
	errno = ENOMEM;
	return NULL;
}